

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O1

void __thiscall CP::queue<int>::push(queue<int> *this,int *element)

{
  size_t sVar1;
  ulong uVar2;
  ulong capacity;
  
  uVar2 = this->mSize + 1;
  if (this->mCap < uVar2) {
    capacity = this->mCap * 2;
    if (capacity <= uVar2) {
      capacity = uVar2;
    }
    expand(this,capacity);
  }
  sVar1 = this->mSize;
  this->mData[(this->mFront + sVar1) % this->mCap] = *element;
  this->mSize = sVar1 + 1;
  return;
}

Assistant:

void push(const T& element) {
      ensureCapacity(mSize+1);
      mData[(mFront + mSize) % mCap] = element;
      mSize++;
    }